

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_to_hex(REF_GRID ref_grid)

{
  int iVar1;
  REF_NODE ref_node;
  REF_GEOM pRVar2;
  REF_CELL pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  REF_INT RVar7;
  REF_INT RVar8;
  REF_INT RVar9;
  uint uVar10;
  uint uVar11;
  REF_STATUS RVar12;
  void *__ptr;
  long lVar13;
  undefined8 uVar14;
  REF_EDGE pRVar15;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  REF_INT RVar19;
  double dVar20;
  REF_INT RVar21;
  int local_228;
  REF_INT node;
  uint local_220;
  REF_INT new_cell;
  REF_EDGE ref_edge;
  int local_20c;
  REF_FACE ref_face;
  REF_GLOB global;
  REF_INT local_1f8;
  REF_INT local_1f4;
  void *local_1f0;
  REF_CELL edg_cell;
  undefined8 local_1e0;
  REF_INT local_1d0;
  REF_INT local_1cc;
  REF_INT quad [27];
  REF_INT nodes [27];
  REF_INT face_nodes [4];
  REF_INT bar [27];
  
  ref_node = ref_grid->node;
  pRVar2 = ref_grid->geom;
  uVar10 = ref_edge_create(&ref_edge,ref_grid);
  if (uVar10 == 0) {
    uVar10 = ref_face_create(&ref_face,ref_grid);
    pRVar15 = ref_edge;
    if (uVar10 == 0) {
      lVar18 = (long)ref_edge->n;
      if (lVar18 < 0) {
        pcVar16 = "malloc edge_node of REF_INT negative";
        uVar14 = 0x9f6;
LAB_001d42f5:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               uVar14,"ref_subdiv_to_hex",pcVar16);
        return 1;
      }
      __ptr = malloc(lVar18 * 4);
      if (__ptr == (void *)0x0) {
        pcVar16 = "malloc edge_node of REF_INT NULL";
        uVar14 = 0x9f6;
      }
      else {
        for (lVar13 = 0; lVar18 != lVar13; lVar13 = lVar13 + 1) {
          *(undefined4 *)((long)__ptr + lVar13 * 4) = 0xffffffff;
        }
        lVar18 = (long)ref_face->n;
        if (lVar18 < 0) {
          pcVar16 = "malloc face_node of REF_INT negative";
          uVar14 = 0x9f7;
          goto LAB_001d42f5;
        }
        local_1f0 = malloc(lVar18 * 4);
        if (local_1f0 != (void *)0x0) {
          for (lVar13 = 0; lVar18 != lVar13; lVar13 = lVar13 + 1) {
            *(undefined4 *)((long)local_1f0 + lVar13 * 4) = 0xffffffff;
          }
          for (local_228 = 0; local_228 < pRVar15->n; local_228 = local_228 + 1) {
            uVar10 = ref_node_next_global(ref_node,&global);
            if (uVar10 != 0) {
              uVar17 = (ulong)uVar10;
              pcVar16 = "next global";
              uVar14 = 0x9fa;
              goto LAB_001d412f;
            }
            uVar10 = ref_node_add(ref_node,global,&node);
            if (uVar10 != 0) {
              uVar17 = (ulong)uVar10;
              pcVar16 = "edge node";
              uVar14 = 0x9fb;
              goto LAB_001d412f;
            }
            *(REF_INT *)((long)__ptr + (long)local_228 * 4) = node;
            uVar10 = ref_node_interpolate_edge
                               (ref_node,ref_edge->e2n[(long)local_228 * 2],
                                ref_edge->e2n[local_228 * 2 + 1],0.5,node);
            if (uVar10 != 0) {
              uVar17 = (ulong)uVar10;
              pcVar16 = "new reals";
              uVar14 = 0x9ff;
              goto LAB_001d412f;
            }
            if ((pRVar2->model != (void *)0x0) &&
               (uVar10 = ref_geom_add_constrain_midnode
                                   (ref_grid,ref_edge->e2n[(long)local_228 * 2],
                                    ref_edge->e2n[local_228 * 2 + 1],0.5,node), uVar10 != 0)) {
              uVar17 = (ulong)uVar10;
              pcVar16 = "new geom";
              uVar14 = 0xa04;
              goto LAB_001d412f;
            }
            pRVar15 = ref_edge;
          }
          pRVar3 = ref_grid->cell[3];
          uVar10 = 0;
          for (local_20c = 0; local_20c < ref_face->n; local_20c = local_20c + 1) {
            uVar11 = ref_node_next_global(ref_node,&global);
            if (uVar11 != 0) {
              pcVar16 = "next global";
              uVar14 = 0xa09;
LAB_001d49b1:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,uVar14,"ref_subdiv_to_hex",(ulong)uVar11,pcVar16);
              return uVar11;
            }
            uVar11 = ref_node_add(ref_node,global,&node);
            if (uVar11 != 0) {
              pcVar16 = "face node";
              uVar14 = 0xa0a;
              goto LAB_001d49b1;
            }
            *(REF_INT *)((long)local_1f0 + (long)local_20c * 4) = node;
            pRVar4 = ref_face->f2n;
            for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
              nodes[lVar18] = pRVar4[local_20c * 4 + lVar18];
            }
            nodes[3] = -1;
            uVar11 = ref_cell_with(pRVar3,nodes,(REF_INT *)&local_220);
            if ((uVar11 != 0) && (uVar11 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0xa11,"ref_subdiv_to_hex",(ulong)uVar11);
              uVar10 = uVar11;
            }
            if ((uVar11 != 5) && (uVar11 != 0)) {
              return uVar10;
            }
            if ((long)(int)local_220 != -1) {
              nodes[3] = pRVar3->c2n[(long)pRVar3->size_per * (long)(int)local_220 + 3];
            }
            uVar11 = ref_node_interpolate_face(ref_node,nodes[0],nodes[1],nodes[2],node);
            if (uVar11 != 0) {
              pcVar16 = "interp new face node";
              uVar14 = 0xa15;
              goto LAB_001d49b1;
            }
            if (((pRVar2->model != (void *)0x0) && (nodes[3] != -1)) &&
               (uVar11 = ref_geom_add_constrain_inside_midnode(ref_grid,nodes,node), uVar11 != 0)) {
              pcVar16 = "geom constrain new face node";
              uVar14 = 0xa18;
              goto LAB_001d49b1;
            }
          }
          pRVar3 = ref_grid->cell[8];
          for (local_220 = 0; (int)local_220 < pRVar3->max; local_220 = local_220 + 1) {
            RVar12 = ref_cell_nodes(pRVar3,local_220,nodes);
            if (RVar12 == 0) {
              for (lVar18 = 0; lVar18 < pRVar3->face_per; lVar18 = lVar18 + 1) {
                pRVar4 = pRVar3->c2n;
                pRVar5 = pRVar3->f2n;
                for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
                  face_nodes[lVar13] =
                       pRVar4[(long)pRVar3->size_per * (long)(int)local_220 +
                              (long)pRVar5[(ulong)((uint)lVar18 & 0x3fffffff) * 4 + lVar13]];
                }
                uVar10 = ref_face_with(ref_face,face_nodes,&local_20c);
                if (uVar10 != 0) {
                  uVar14 = 0xa29;
                  goto LAB_001d49e6;
                }
                if ((long)local_20c == -1) {
                  pcVar16 = "tet face not found";
                  uVar14 = 0xa2a;
                  goto LAB_001d42f5;
                }
                *(undefined4 *)((long)&edg_cell + lVar18 * 4) =
                     *(undefined4 *)((long)local_1f0 + (long)local_20c * 4);
              }
              for (lVar18 = 0; lVar18 < pRVar3->edge_per; lVar18 = lVar18 + 1) {
                lVar13 = (long)(int)local_220 * (long)pRVar3->size_per;
                uVar10 = ref_edge_with(ref_edge,pRVar3->c2n[pRVar3->e2n[lVar18 * 2] + lVar13],
                                       pRVar3->c2n
                                       [(long)(int)lVar13 + (long)pRVar3->e2n[lVar18 * 2 + 1]],
                                       &local_228);
                if (uVar10 != 0) {
                  uVar17 = (ulong)uVar10;
                  pcVar16 = "find edge";
                  uVar14 = 0xa31;
                  goto LAB_001d412f;
                }
                if ((long)local_228 == -1) {
                  pcVar16 = "tet edge not found";
                  uVar14 = 0xa32;
                  goto LAB_001d42f5;
                }
                bar[lVar18] = *(REF_INT *)((long)__ptr + (long)local_228 * 4);
              }
              uVar10 = ref_node_next_global(ref_node,&global);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "next global";
                uVar14 = 0xa36;
                goto LAB_001d412f;
              }
              uVar10 = ref_node_add(ref_node,global,&node);
              RVar9 = bar[2];
              RVar8 = bar[1];
              RVar7 = bar[0];
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "edge node";
                uVar14 = 0xa37;
                goto LAB_001d412f;
              }
              pRVar6 = ref_node->real;
              uVar10 = pRVar3->node_per;
              if (pRVar3->node_per < 1) {
                uVar10 = 0;
              }
              for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
                pRVar6[(long)node * 0xf + lVar18] = 0.0;
                dVar20 = 0.0;
                for (uVar17 = 0; uVar10 != uVar17; uVar17 = uVar17 + 1) {
                  dVar20 = dVar20 + pRVar6[lVar18 + (long)nodes[uVar17] * 0xf] * 0.25;
                  pRVar6[(long)node * 0xf + lVar18] = dVar20;
                }
              }
              quad[0] = nodes[0];
              quad[1] = bar[0];
              RVar21 = (REF_INT)((ulong)local_1e0 >> 0x20);
              RVar19 = (REF_INT)local_1e0;
              quad[3] = bar[1];
              quad[4] = bar[2];
              quad[6] = node;
              local_1f4 = edg_cell._4_4_;
              quad[7] = edg_cell._4_4_;
              quad[2] = RVar21;
              quad[5] = RVar19;
              uVar10 = ref_cell_add(ref_grid->cell[0xb],quad,&new_cell);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "add";
                uVar14 = 0xa48;
                goto LAB_001d412f;
              }
              quad[0] = nodes[1];
              local_1cc = bar[3];
              quad[1] = bar[3];
              quad[3] = RVar7;
              local_1d0 = bar[4];
              quad[4] = bar[4];
              local_1f8 = (REF_INT)edg_cell;
              quad[5] = (REF_INT)edg_cell;
              quad[6] = node;
              quad[2] = RVar21;
              quad[7] = RVar19;
              uVar10 = ref_cell_add(ref_grid->cell[0xb],quad,&new_cell);
              RVar7 = bar[5];
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "add";
                uVar14 = 0xa52;
                goto LAB_001d412f;
              }
              quad[0] = nodes[2];
              quad[1] = RVar8;
              quad[3] = local_1cc;
              quad[4] = bar[5];
              quad[5] = local_1f4;
              quad[6] = node;
              quad[7] = local_1f8;
              quad[2] = RVar21;
              uVar10 = ref_cell_add(ref_grid->cell[0xb],quad,&new_cell);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "add";
                uVar14 = 0xa5c;
                goto LAB_001d412f;
              }
              quad[0] = nodes[3];
              quad[1] = local_1d0;
              quad[3] = RVar9;
              quad[4] = RVar7;
              quad[5] = local_1f8;
              quad[6] = node;
              quad[7] = local_1f4;
              quad[2] = RVar19;
              uVar10 = ref_cell_add(ref_grid->cell[0xb],quad,&new_cell);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "add";
                uVar14 = 0xa66;
                goto LAB_001d412f;
              }
              uVar10 = ref_cell_remove(pRVar3,local_220);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "remove tet";
                uVar14 = 0xa68;
                goto LAB_001d412f;
              }
            }
          }
          pRVar3 = ref_grid->cell[3];
          for (local_220 = 0; (int)local_220 < pRVar3->max; local_220 = local_220 + 1) {
            RVar12 = ref_cell_nodes(pRVar3,local_220,nodes);
            if (RVar12 == 0) {
              for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
                face_nodes[lVar18] = nodes[lVar18];
              }
              face_nodes[3] = face_nodes[0];
              uVar10 = ref_face_with(ref_face,face_nodes,&local_20c);
              if (uVar10 != 0) {
                uVar14 = 0xa72;
LAB_001d49e6:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,uVar14,"ref_subdiv_to_hex",(ulong)uVar10,"find face");
                printf("%d tri %d %d %d  %d\n",(ulong)local_220,(ulong)(uint)nodes[0],
                       (ulong)(uint)nodes[1],(ulong)(uint)nodes[2],(ulong)(uint)nodes[3]);
                return uVar10;
              }
              if ((long)local_20c == -1) {
                pcVar16 = "tri face not found";
                uVar14 = 0xa73;
                goto LAB_001d42f5;
              }
              node = *(REF_INT *)((long)local_1f0 + (long)local_20c * 4);
              quad[ref_grid->cell[6]->node_per] = nodes[ref_grid->cell[3]->node_per];
              quad[0] = nodes[0];
              uVar10 = ref_edge_with(ref_edge,nodes[0],nodes[1],&local_228);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "find edge after";
                uVar14 = 0xa78;
                goto LAB_001d412f;
              }
              quad[1] = *(REF_INT *)((long)__ptr + (long)local_228 * 4);
              quad[2] = node;
              uVar10 = ref_edge_with(ref_edge,nodes[2],nodes[0],&local_228);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "find edge before";
                uVar14 = 0xa7b;
                goto LAB_001d412f;
              }
              quad[3] = *(REF_INT *)((long)__ptr + (long)local_228 * 4);
              uVar10 = ref_cell_add(ref_grid->cell[6],quad,&new_cell);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "add";
                uVar14 = 0xa7d;
                goto LAB_001d412f;
              }
              quad[0] = nodes[1];
              uVar10 = ref_edge_with(ref_edge,nodes[1],nodes[2],&local_228);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "find edge after";
                uVar14 = 0xa7f;
                goto LAB_001d412f;
              }
              quad[1] = *(REF_INT *)((long)__ptr + (long)local_228 * 4);
              quad[2] = node;
              uVar10 = ref_edge_with(ref_edge,nodes[0],nodes[1],&local_228);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "find edge before";
                uVar14 = 0xa82;
                goto LAB_001d412f;
              }
              quad[3] = *(REF_INT *)((long)__ptr + (long)local_228 * 4);
              uVar10 = ref_cell_add(ref_grid->cell[6],quad,&new_cell);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "add";
                uVar14 = 0xa84;
                goto LAB_001d412f;
              }
              quad[0] = nodes[2];
              uVar10 = ref_edge_with(ref_edge,nodes[2],nodes[0],&local_228);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "find edge after";
                uVar14 = 0xa86;
                goto LAB_001d412f;
              }
              quad[1] = *(REF_INT *)((long)__ptr + (long)local_228 * 4);
              quad[2] = node;
              uVar10 = ref_edge_with(ref_edge,nodes[1],nodes[2],&local_228);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "find edge before";
                uVar14 = 0xa89;
                goto LAB_001d412f;
              }
              quad[3] = *(REF_INT *)((long)__ptr + (long)local_228 * 4);
              uVar10 = ref_cell_add(ref_grid->cell[6],quad,&new_cell);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "add";
                uVar14 = 0xa8b;
                goto LAB_001d412f;
              }
              uVar10 = ref_cell_remove(pRVar3,local_220);
              if (uVar10 != 0) {
                uVar17 = (ulong)uVar10;
                pcVar16 = "remove tri";
                uVar14 = 0xa8c;
                goto LAB_001d412f;
              }
            }
          }
          pRVar3 = ref_grid->cell[0];
          uVar11 = 0;
          uVar10 = ref_cell_create(&edg_cell,REF_CELL_EDG);
          if (uVar10 == 0) {
            while (local_220 = uVar11, (int)uVar11 < pRVar3->max) {
              RVar12 = ref_cell_nodes(pRVar3,uVar11,nodes);
              if (RVar12 == 0) {
                iVar1 = ref_grid->cell[0]->node_per;
                bar[iVar1] = nodes[iVar1];
                bar[0] = nodes[0];
                uVar10 = ref_edge_with(ref_edge,nodes[0],nodes[1],&local_228);
                if (uVar10 != 0) {
                  uVar17 = (ulong)uVar10;
                  pcVar16 = "find edge";
                  uVar14 = 0xa95;
                  goto LAB_001d412f;
                }
                bar[1] = *(REF_INT *)((long)__ptr + (long)local_228 * 4);
                uVar10 = ref_cell_add((REF_CELL)CONCAT44(edg_cell._4_4_,(REF_INT)edg_cell),bar,
                                      &new_cell);
                if (uVar10 != 0) {
                  uVar17 = (ulong)uVar10;
                  pcVar16 = "add";
                  uVar14 = 0xa97;
                  goto LAB_001d412f;
                }
                bar[0] = *(REF_INT *)((long)__ptr + (long)local_228 * 4);
                bar[1] = nodes[1];
                uVar10 = ref_cell_add((REF_CELL)CONCAT44(edg_cell._4_4_,(REF_INT)edg_cell),bar,
                                      &new_cell);
                if (uVar10 != 0) {
                  uVar17 = (ulong)uVar10;
                  pcVar16 = "add";
                  uVar14 = 0xa9a;
                  goto LAB_001d412f;
                }
              }
              uVar11 = local_220 + 1;
            }
            uVar10 = ref_cell_free(ref_grid->cell[0]);
            if (uVar10 == 0) {
              ref_grid->cell[0] = (REF_CELL)CONCAT44(edg_cell._4_4_,(REF_INT)edg_cell);
              free(local_1f0);
              free(__ptr);
              uVar10 = ref_face_free(ref_face);
              if (uVar10 == 0) {
                uVar10 = ref_edge_free(ref_edge);
                if (uVar10 == 0) {
                  uVar10 = ref_node_synchronize_globals(ref_node);
                  if (uVar10 == 0) {
                    return 0;
                  }
                  uVar17 = (ulong)uVar10;
                  pcVar16 = "sync globals";
                  uVar14 = 0xaa4;
                }
                else {
                  uVar17 = (ulong)uVar10;
                  pcVar16 = "free edge";
                  uVar14 = 0xaa2;
                }
              }
              else {
                uVar17 = (ulong)uVar10;
                pcVar16 = "free face";
                uVar14 = 0xaa1;
              }
            }
            else {
              uVar17 = (ulong)uVar10;
              pcVar16 = "free old edge";
              uVar14 = 0xa9c;
            }
          }
          else {
            uVar17 = (ulong)uVar10;
            pcVar16 = "new edges";
            uVar14 = 0xa90;
          }
          goto LAB_001d412f;
        }
        pcVar16 = "malloc face_node of REF_INT NULL";
        uVar14 = 0x9f7;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             uVar14,"ref_subdiv_to_hex",pcVar16);
      return 2;
    }
    uVar17 = (ulong)uVar10;
    pcVar16 = "create face";
    uVar14 = 0x9f5;
  }
  else {
    uVar17 = (ulong)uVar10;
    pcVar16 = "create edge";
    uVar14 = 0x9f4;
  }
LAB_001d412f:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar14,
         "ref_subdiv_to_hex",uVar17,pcVar16);
  return (REF_STATUS)uVar17;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_to_hex(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_FACE ref_face;
  REF_INT *edge_node, *face_node, face, edge, node, new_cell, i;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], face_nodes[4];
  REF_INT quad[REF_CELL_MAX_SIZE_PER], bar[REF_CELL_MAX_SIZE_PER];
  REF_GLOB global;
  REF_CELL edg_cell;

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  RSS(ref_face_create(&ref_face, ref_grid), "create face");
  ref_malloc_init(edge_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  ref_malloc_init(face_node, ref_face_n(ref_face), REF_INT, REF_EMPTY);

  each_ref_edge(ref_edge, edge) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "edge node");
    edge_node[edge] = node;
    RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                  ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
        "new reals");
    if (ref_geom_model_loaded(ref_geom))
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
          "new geom");
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_face(ref_face, face) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "face node");
    face_node[face] = node;

    for (i = 0; i < 3; i++) {
      nodes[i] = ref_face_f2n(ref_face, i, face);
    }
    nodes[3] = REF_EMPTY;
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find tri");
    if (REF_EMPTY != cell) nodes[3] = ref_cell_c2n(ref_cell, 3, cell);

    RSS(ref_node_interpolate_face(ref_node, nodes[0], nodes[1], nodes[2], node),
        "interp new face node");
    if (ref_geom_model_loaded(ref_geom) && REF_EMPTY != nodes[3]) {
      RSS(ref_geom_add_constrain_inside_midnode(ref_grid, nodes, node),
          "geom constrain new face node");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    REF_INT tet_face_nodes[4], tet_edge_nodes[6];
    REF_INT cell_face, cell_edge, cell_node;
    REF_INT hex[REF_CELL_MAX_SIZE_PER];

    each_ref_cell_cell_face(ref_cell, cell_face) {
      /* repeat first node to mark tri */
      for (i = 0; i < 4; i++)
        face_nodes[i] = ref_cell_f2n(ref_cell, i, cell_face, cell);
      RSB(ref_face_with(ref_face, face_nodes, &face), "find face", {
        printf("%d tri %d %d %d  %d\n", cell, nodes[0], nodes[1], nodes[2],
               nodes[3]);
      });
      RUS(REF_EMPTY, face, "tet face not found");
      tet_face_nodes[cell_face] = face_node[face];
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      RSS(ref_edge_with(ref_edge, ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                        ref_cell_e2n(ref_cell, 1, cell_edge, cell), &edge),
          "find edge");
      RUS(REF_EMPTY, edge, "tet edge not found");
      tet_edge_nodes[cell_edge] = edge_node[edge];
    }

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "edge node");
    for (i = 0; i < 3; i++) {
      ref_node_xyz(ref_node, i, node) = 0.0;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_node_xyz(ref_node, i, node) +=
            0.25 * ref_node_xyz(ref_node, i, nodes[cell_node]);
      }
    }

    hex[0] = nodes[0];
    hex[1] = tet_edge_nodes[0];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[1];
    hex[4] = tet_edge_nodes[2];
    hex[5] = tet_face_nodes[2];
    hex[6] = node;
    hex[7] = tet_face_nodes[1];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[1];
    hex[1] = tet_edge_nodes[3];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[0];
    hex[4] = tet_edge_nodes[4];
    hex[5] = tet_face_nodes[0];
    hex[6] = node;
    hex[7] = tet_face_nodes[2];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[2];
    hex[1] = tet_edge_nodes[1];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[3];
    hex[4] = tet_edge_nodes[5];
    hex[5] = tet_face_nodes[1];
    hex[6] = node;
    hex[7] = tet_face_nodes[0];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[3];
    hex[1] = tet_edge_nodes[4];
    hex[2] = tet_face_nodes[2];
    hex[3] = tet_edge_nodes[2];
    hex[4] = tet_edge_nodes[5];
    hex[5] = tet_face_nodes[0];
    hex[6] = node;
    hex[7] = tet_face_nodes[1];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    RSS(ref_cell_remove(ref_cell, cell), "remove tet");
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (i = 0; i < 3; i++) face_nodes[i] = nodes[i];
    face_nodes[3] = face_nodes[0]; /* repeat first node to mark tri */
    RSB(ref_face_with(ref_face, face_nodes, &face), "find face", {
      printf("%d tri %d %d %d  %d\n", cell, nodes[0], nodes[1], nodes[2],
             nodes[3]);
    });
    RUS(REF_EMPTY, face, "tri face not found");
    node = face_node[face];
    quad[ref_cell_id_index(ref_grid_qua(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_tri(ref_grid))];
    quad[0] = nodes[0];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    quad[0] = nodes[1];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    quad[0] = nodes[2];
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    RSS(ref_cell_remove(ref_cell, cell), "remove tri");
  }

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_create(&edg_cell, REF_CELL_EDG), "new edges");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bar[ref_cell_id_index(ref_grid_edg(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_edg(ref_grid))];
    bar[0] = nodes[0];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge");
    bar[1] = edge_node[edge];
    RSS(ref_cell_add(edg_cell, bar, &new_cell), "add");
    bar[0] = edge_node[edge];
    bar[1] = nodes[1];
    RSS(ref_cell_add(edg_cell, bar, &new_cell), "add");
  }
  RSS(ref_cell_free(ref_grid_edg(ref_grid)), "free old edge");
  ref_grid_edg(ref_grid) = edg_cell;

  ref_free(face_node);
  ref_free(edge_node);
  RSS(ref_face_free(ref_face), "free face");
  RSS(ref_edge_free(ref_edge), "free edge");

  RSS(ref_node_synchronize_globals(ref_node), "sync globals");

  return REF_SUCCESS;
}